

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

void split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *results,string *input,char delimiter)

{
  string *psVar1;
  long lVar2;
  value_type local_80;
  value_type local_50;
  long local_30;
  size_type i;
  size_type start;
  string *psStack_18;
  char delimiter_local;
  string *input_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results_local;
  
  start._7_1_ = delimiter;
  psStack_18 = input;
  input_local = (string *)results;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  i = 0;
  while( true ) {
    local_30 = std::__cxx11::string::find((char)psStack_18,(ulong)(uint)(int)start._7_1_);
    psVar1 = input_local;
    if (local_30 == -1) break;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)psStack_18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)psVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    i = local_30 + 1;
  }
  lVar2 = std::__cxx11::string::length();
  psVar1 = input_local;
  if (lVar2 != 0) {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)psStack_18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)psVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

void split (
  std::vector<std::string>& results,
  const std::string& input,
  const char delimiter)
{
  results.clear ();
  std::string::size_type start = 0;
  std::string::size_type i;
  while ((i = input.find (delimiter, start)) != std::string::npos)
  {
    results.push_back (input.substr (start, i - start));
    start = i + 1;
  }

  if (input.length ())
    results.push_back (input.substr (start));
}